

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testDecodeRobustness(void)

{
  Territory tc_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  char acStack_3e98 [4];
  Territory tc;
  char largeString [16000];
  int local_10;
  char s1 [1];
  int i;
  int nrTests;
  
  tc_00 = getTerritoryCode("NLD",TERRITORY_NONE);
  iVar1 = testIncorrectDecode("",TERRITORY_NONE);
  iVar2 = testIncorrectDecode(" ",TERRITORY_NONE);
  iVar3 = testIncorrectDecode("AA",TERRITORY_NONE);
  iVar4 = testIncorrectDecode("",tc_00);
  iVar5 = testIncorrectDecode(" ",tc_00);
  iVar6 = testIncorrectDecode("AA",tc_00);
  iVar7 = testIncorrectDecode("XX.XX",TERRITORY_NONE);
  iVar8 = testCorrectDecode("NLD XX.XX",tc_00);
  iVar9 = testCorrectDecode("NLD 39.UC",tc_00);
  iVar10 = testCorrectDecode("W9.SX9",tc_00);
  iVar11 = testCorrectDecode("MEX 49.4V",tc_00);
  iVar12 = testCorrectDecode("NLD XX.XX",TERRITORY_NONE);
  iVar13 = testCorrectDecode("MX XX.XX",TERRITORY_NONE);
  largeString[15999] = '\0';
  iVar14 = testIncorrectDecode(largeString + 15999,TERRITORY_NONE);
  iVar15 = testIncorrectDecode(largeString + 15999,tc_00);
  for (local_10 = 0; local_10 < 15999; local_10 = local_10 + 1) {
    acStack_3e98[local_10] = (char)(local_10 % 0xdf) + ' ';
  }
  largeString[0x3e77] = '\0';
  iVar16 = testIncorrectDecode(largeString + 15999,TERRITORY_NONE);
  iVar17 = testIncorrectDecode(largeString + 15999,tc_00);
  return iVar17 + iVar16 + iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + 
                                                  iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + 
                                                  iVar1;
}

Assistant:

static int testDecodeRobustness(void) {
    int nrTests = 0;
    int i;
    char s1[1];
    char largeString[16000];

    enum Territory tc = getTerritoryCode("NLD", TERRITORY_NONE);
    nrTests += testIncorrectDecode("", TERRITORY_NONE);
    nrTests += testIncorrectDecode(" ", TERRITORY_NONE);
    nrTests += testIncorrectDecode("AA", TERRITORY_NONE);
    nrTests += testIncorrectDecode("", tc);
    nrTests += testIncorrectDecode(" ", tc);
    nrTests += testIncorrectDecode("AA", tc);
    nrTests += testIncorrectDecode("XX.XX", TERRITORY_NONE);
    nrTests += testCorrectDecode("NLD XX.XX", tc);
    nrTests += testCorrectDecode("NLD 39.UC", tc);
    nrTests += testCorrectDecode("W9.SX9", tc);
    nrTests += testCorrectDecode("MEX 49.4V", tc);
    nrTests += testCorrectDecode("NLD XX.XX", TERRITORY_NONE);
    nrTests += testCorrectDecode("MX XX.XX", TERRITORY_NONE);

    s1[0] = 0;
    nrTests += testIncorrectDecode(s1, TERRITORY_NONE);
    nrTests += testIncorrectDecode(s1, tc);

    for (i = 0; i < (int) sizeof(largeString) - 1; ++i) {
        largeString[i] = (char) ((i % 223) + 32);
    }
    largeString[sizeof(largeString) - 1] = 0;
    nrTests += testIncorrectDecode(s1, TERRITORY_NONE);
    nrTests += testIncorrectDecode(s1, tc);
    return nrTests;
}